

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedAllStagesOneImage::Setup(AdvancedAllStagesOneImage *this)

{
  AdvancedAllStagesOneImage *this_local;
  
  this->m_program = 0;
  this->m_vao = 0;
  this->m_vbo = 0;
  this->m_ebo = 0;
  this->m_buffer = 0;
  this->m_buffer_tex = 0;
  this->m_texture = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_program	= 0;
		m_vao		 = 0;
		m_vbo		 = 0;
		m_ebo		 = 0;
		m_buffer	 = 0;
		m_buffer_tex = 0;
		m_texture	= 0;
		return NO_ERROR;
	}